

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall google::protobuf::FieldDescriptor::is_packed(FieldDescriptor *this)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  
  bVar2 = is_packable(this);
  if (bVar2) {
    lVar1 = *(long *)(this + 0x78);
    if (*(int *)(*(long *)(this + 0x28) + 0x3c) == 2) {
      if (lVar1 == 0) goto LAB_002926e4;
    }
    else {
      if (lVar1 == 0) {
        return true;
      }
      if ((*(byte *)(lVar1 + 0x28) & 2) == 0) {
        return true;
      }
    }
    uVar3 = *(undefined1 *)(lVar1 + 0x4c);
  }
  else {
LAB_002926e4:
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

bool FieldDescriptor::is_packed() const {
  if (!is_packable()) return false;
  if (file_->syntax() == FileDescriptor::SYNTAX_PROTO2) {
    return (options_ != nullptr) && options_->packed();
  } else {
    return options_ == nullptr || !options_->has_packed() || options_->packed();
  }
}